

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_texture_region
               (rf_texture2d texture,rf_rec source_rec,rf_rec dest_rec,rf_vec2 origin,float rotation
               ,rf_color tint)

{
  float fVar1;
  float fVar2;
  float x;
  float fVar3;
  float fVar4;
  float y;
  float fVar5;
  undefined4 local_78;
  undefined4 local_48;
  
  fVar1 = source_rec.x;
  fVar5 = source_rec.y;
  if (texture.id != 0) {
    fVar2 = source_rec.width;
    fVar3 = source_rec.height;
    fVar4 = fVar2;
    if (fVar2 < 0.0) {
      fVar4 = -fVar2;
    }
    if (fVar3 < 0.0) {
      fVar5 = fVar5 - fVar3;
    }
    x = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar1 | -(uint)(fVar2 < 0.0) & (uint)(fVar4 + fVar1))
        / (float)texture.width;
    y = fVar5 / (float)texture.height;
    fVar5 = (fVar3 + fVar5) / (float)texture.height;
    if (0.0 <= fVar2) {
      fVar1 = fVar4 + fVar1;
    }
    rf_gfx_enable_texture(texture.id);
    rf_gfx_push_matrix();
    local_48 = dest_rec.x;
    rf_gfx_translatef(local_48,dest_rec.y,0.0);
    rf_gfx_rotatef(rotation,0.0,0.0,1.0);
    rf_gfx_translatef(-origin.x,-origin.y,0.0);
    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
    rf_gfx_tex_coord2f(x,y);
    rf_gfx_vertex2f(0.0,0.0);
    rf_gfx_tex_coord2f(x,fVar5);
    rf_gfx_vertex2f(0.0,dest_rec.height);
    fVar1 = fVar1 / (float)texture.width;
    rf_gfx_tex_coord2f(fVar1,fVar5);
    local_78 = dest_rec.width;
    rf_gfx_vertex2f(local_78,dest_rec.height);
    rf_gfx_tex_coord2f(fVar1,y);
    rf_gfx_vertex2f(local_78,0.0);
    rf_gfx_end();
    rf_gfx_pop_matrix();
    rf_gfx_disable_texture();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_texture_region(rf_texture2d texture, rf_rec source_rec, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flip_x = false;

        if (source_rec.width < 0) { flip_x = true; source_rec.width *= -1; }
        if (source_rec.height < 0) source_rec.y -= source_rec.height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
            rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
            rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
            rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

            rf_gfx_begin(RF_QUADS);
                rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
                rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                rf_gfx_vertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(0.0f, dest_rec.height);

                // Top-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(dest_rec.width, dest_rec.height);

                // Top-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                rf_gfx_vertex2f(dest_rec.width, 0.0f);
            rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();
    }
}